

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O2

int IDASetNoInactiveRootWarn(void *ida_mem)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x29f,"IDASetNoInactiveRootWarn",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    *(undefined4 *)((long)ida_mem + 0x4a8) = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDASetNoInactiveRootWarn(void* ida_mem)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  IDA_mem->ida_mxgnull = 0;

  return (IDA_SUCCESS);
}